

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void testComp(string *tempdir,exr_compression_t comp)

{
  void *pvVar1;
  long lVar2;
  pixels p;
  long alStack_e0 [2];
  pixels local_d0;
  
  alStack_e0[0] = 0x10ec3b;
  pixels::pixels(&local_d0,0x55b,0x9f,0x560);
  alStack_e0[0] = 0x10ec43;
  pixels::fillZero(&local_d0);
  alStack_e0[0] = 0x10ec57;
  testWriteRead(&local_d0,tempdir,comp,"zeroes");
  alStack_e0[0] = 0x10ec64;
  pixels::fillPattern1(&local_d0);
  alStack_e0[0] = 0x10ec78;
  testWriteRead(&local_d0,tempdir,comp,"pattern1");
  alStack_e0[0] = 0x10ec85;
  pixels::fillPattern2(&local_d0);
  alStack_e0[0] = 0x10ec99;
  testWriteRead(&local_d0,tempdir,comp,"pattern2");
  alStack_e0[0] = 0x10eca3;
  pixels::fillRandom(&local_d0);
  alStack_e0[0] = 0x10ecb9;
  testWriteRead(&local_d0,tempdir,comp,"random");
  lVar2 = 0xb0;
  do {
    pvVar1 = *(void **)((long)alStack_e0 + lVar2);
    if (pvVar1 != (void *)0x0) {
      alStack_e0[0] = 0x10ecd5;
      operator_delete(pvVar1,*(long *)((long)local_d0.rgba + lVar2 + -0x58) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0x50);
  if (local_d0.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_e0[0] = 0x10ecf6;
    operator_delete(local_d0.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.h.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.h.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    alStack_e0[0] = 0x10ed0d;
    operator_delete(local_d0.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d0.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    alStack_e0[0] = 0x10ed24;
    operator_delete(local_d0.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void
testComp (const std::string& tempdir, exr_compression_t comp)
{
    pixels p{IMG_WIDTH, IMG_HEIGHT, IMG_STRIDE_X};

    p.fillZero ();
    testWriteRead (p, tempdir, comp, "zeroes");
    p.fillPattern1 ();
    testWriteRead (p, tempdir, comp, "pattern1");
    p.fillPattern2 ();
    testWriteRead (p, tempdir, comp, "pattern2");
    p.fillRandom ();
    testWriteRead (p, tempdir, comp, "random");
}